

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O3

size_t fiobj_str_write_i(FIOBJ dest,int64_t num)

{
  fio_str_s_conflict *s;
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  char buf [22];
  fio_str_info_s local_50;
  char local_38 [32];
  
  if (((uint)dest & 7) != 2) {
    __assert_fail("FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_str.c"
                  ,0x103,"size_t fiobj_str_write_i(FIOBJ, int64_t)");
  }
  uVar4 = dest & 0xfffffffffffffff8;
  if (*(char *)(uVar4 + 0x11) != '\0') {
    return 0;
  }
  s = (fio_str_s_conflict *)(uVar4 + 0x10);
  *(undefined8 *)(uVar4 + 8) = 0;
  if (num == 0) {
    bVar1 = s->small;
    if (bVar1 == 0) {
      if (*(long *)(uVar4 + 0x38) == 0) {
        uVar7 = 1;
        goto LAB_00144a24;
      }
      uVar7 = *(ulong *)(uVar4 + 0x28) + 1;
      if (*(ulong *)(uVar4 + 0x20) <= uVar7) {
        uVar8 = *(ulong *)(uVar4 + 0x20);
        if (*(long *)(uVar4 + 0x30) == 0) {
          uVar8 = *(ulong *)(uVar4 + 0x28);
        }
        *(ulong *)(uVar4 + 0x28) = uVar8;
        goto LAB_001449fe;
      }
    }
    else {
      uVar7 = (ulong)(bVar1 >> 1) + 1;
      if (bVar1 < 0x5a) {
LAB_00144a24:
        *(char *)(uVar4 + 0x10) = (char)uVar7 * '\x02' + '\x01';
        *(undefined1 *)(uVar4 + 0x12 + uVar7) = 0;
        lVar5 = uVar4 + 0x12;
        goto LAB_00144a37;
      }
      s->small = '[';
LAB_001449fe:
      fio_str_capa_assert(&local_50,s,uVar7);
    }
    *(ulong *)(uVar4 + 0x28) = uVar7;
    *(undefined1 *)(*(long *)(uVar4 + 0x38) + uVar7) = 0;
    lVar5 = *(long *)(uVar4 + 0x38);
LAB_00144a37:
    *(undefined1 *)(lVar5 + -1 + uVar7) = 0x30;
    return uVar7;
  }
  uVar7 = -num;
  if (0 < num) {
    uVar7 = num;
  }
  uVar8 = 0;
  do {
    uVar3 = uVar8;
    local_38[uVar3] = (char)(uVar7 / 10) * -10 + (char)uVar7 + '0';
    uVar8 = uVar3 + 1;
    bVar2 = 9 < uVar7;
    uVar7 = uVar7 / 10;
  } while (bVar2);
  if (num < 0) {
    local_38[uVar3 + 1] = '-';
    uVar8 = uVar3 + 2;
  }
  if (s->small == 0) {
    uVar7 = uVar8;
    if (*(long *)(uVar4 + 0x38) == 0) goto LAB_00144928;
    uVar7 = *(ulong *)(uVar4 + 0x28) + uVar8;
    if (*(ulong *)(uVar4 + 0x20) <= uVar7) {
      uVar3 = *(ulong *)(uVar4 + 0x20);
      if (*(long *)(uVar4 + 0x30) == 0) {
        uVar3 = *(ulong *)(uVar4 + 0x28);
      }
      *(ulong *)(uVar4 + 0x28) = uVar3;
      goto LAB_00144995;
    }
  }
  else {
    uVar7 = (s->small >> 1) + uVar8;
LAB_00144928:
    if (uVar7 < 0x2e) {
      *(char *)(uVar4 + 0x10) = (char)uVar7 * '\x02' + '\x01';
      *(undefined1 *)(uVar4 + 0x12 + uVar7) = 0;
      lVar5 = uVar4 + 0x12;
      goto LAB_001449b3;
    }
    s->small = '[';
LAB_00144995:
    fio_str_capa_assert(&local_50,s,uVar7);
  }
  *(ulong *)(uVar4 + 0x28) = uVar7;
  *(undefined1 *)(*(long *)(uVar4 + 0x38) + uVar7) = 0;
  lVar5 = *(long *)(uVar4 + 0x38);
LAB_001449b3:
  if (uVar8 != 0) {
    pcVar6 = (char *)(lVar5 + (uVar7 - uVar8));
    do {
      *pcVar6 = local_38[uVar8 - 1];
      pcVar6 = pcVar6 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  return uVar7;
}

Assistant:

size_t fiobj_str_write_i(FIOBJ dest, int64_t num) {
  assert(FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING));
  if (obj2str(dest)->str.frozen)
    return 0;
  obj2str(dest)->hash = 0;
  return fio_str_write_i(&obj2str(dest)->str, num).len;
}